

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

int cs_op_index(csh ud,cs_insn *insn,uint op_type,uint post)

{
  cs_detail *pcVar1;
  int iVar2;
  x86_avx_rm *pxVar3;
  arm_op_type *paVar4;
  cs_x86_op *pcVar5;
  int32_t *piVar6;
  x86_reg *pxVar7;
  arm_vectordata_type *paVar8;
  cs_arm_op *pcVar9;
  arm_cpsflag_type *paVar10;
  int *piVar11;
  arm_cc *paVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  
  iVar2 = -1;
  if (ud == 0) {
    return iVar2;
  }
  if (*(int *)(ud + 0x60) != 0) {
    if (insn->id == 0) {
      *(undefined4 *)(ud + 0x50) = 0xb;
      return iVar2;
    }
    pcVar1 = insn->detail;
    if (pcVar1 != (cs_detail *)0x0) {
      *(undefined4 *)(ud + 0x50) = 0;
      switch(*(undefined4 *)ud) {
      case 0:
        uVar13 = (ulong)(pcVar1->field_6).arm.op_count;
        if (uVar13 == 0) {
          return iVar2;
        }
        pxVar3 = &(pcVar1->field_6).x86.avx_rm;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*pxVar3 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          pxVar3 = pxVar3 + 0xc;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 1:
        uVar13 = (ulong)(pcVar1->field_6).x86.opcode[2];
        if (uVar13 == 0) {
          return iVar2;
        }
        pxVar7 = &(pcVar1->field_6).x86.sib_base;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*pxVar7 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          pxVar7 = pxVar7 + 0xe;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 2:
        uVar13 = (ulong)(pcVar1->field_6).x86.prefix[0];
        if (uVar13 == 0) {
          return iVar2;
        }
        paVar8 = &(pcVar1->field_6).arm.vector_data;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*paVar8 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          paVar8 = paVar8 + 6;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 3:
        uVar13 = (ulong)(pcVar1->field_6).x86.op_count;
        if (uVar13 == 0) {
          return iVar2;
        }
        pcVar5 = (pcVar1->field_6).x86.operands;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (pcVar5->type == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          pcVar5 = pcVar5 + 1;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 4:
        uVar13 = (ulong)(pcVar1->field_6).x86.addr_size;
        if (uVar13 == 0) {
          return iVar2;
        }
        pcVar9 = (cs_arm_op *)&(pcVar1->field_6).arm.cps_flag;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (pcVar9->vector_index == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          pcVar9 = (cs_arm_op *)((pcVar9->field_3).field5 + 8);
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 5:
        uVar13 = (ulong)(pcVar1->field_6).x86.rex;
        if (uVar13 == 0) {
          return iVar2;
        }
        paVar10 = &(pcVar1->field_6).arm.cps_flag;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*paVar10 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          paVar10 = paVar10 + 4;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 6:
        uVar13 = (ulong)(pcVar1->field_6).x86.opcode[0];
        if (uVar13 == 0) {
          return iVar2;
        }
        pcVar9 = (cs_arm_op *)&(pcVar1->field_6).arm.vector_data;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (pcVar9->vector_index == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          pcVar9 = (cs_arm_op *)((pcVar9->field_3).field5 + 0x10);
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 7:
        uVar13 = (ulong)(pcVar1->field_6).x86.prefix[0];
        if (uVar13 == 0) {
          return iVar2;
        }
        paVar12 = (arm_cc *)&(pcVar1->field_6).arm.vector_size;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*paVar12 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          paVar12 = paVar12 + 4;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 8:
        uVar13 = (ulong)(pcVar1->field_6).m68k.op_count;
        if (uVar13 == 0) {
          return iVar2;
        }
        piVar6 = &(pcVar1->field_6).arm64.operands[0].field_6.mem.disp;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*piVar6 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          piVar6 = piVar6 + 0xe;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 9:
        uVar13 = (ulong)(pcVar1->field_6).x86.prefix[0];
        if (uVar13 == 0) {
          return iVar2;
        }
        piVar11 = &(pcVar1->field_6).arm.vector_size;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*piVar11 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          piVar11 = piVar11 + 8;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 10:
        uVar13 = (ulong)(pcVar1->field_6).x86.prefix[1];
        if (uVar13 == 0) {
          return iVar2;
        }
        paVar4 = (arm_op_type *)&(pcVar1->field_6).arm.vector_size;
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*paVar4 == op_type) + uVar15, uVar15 != post) {
          uVar14 = uVar14 + 1;
          paVar4 = paVar4 + 6;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      case 0xb:
        return iVar2;
      case 0xc:
        uVar13 = (ulong)(pcVar1->field_6).x86.opcode[1];
        if (uVar13 == 0) {
          return iVar2;
        }
        uVar14 = 0;
        uVar15 = 0;
        while (uVar15 = (*(uint *)(pcVar1->groups + uVar14 * 8 + 0x15) == op_type) + uVar15,
              uVar15 != post) {
          uVar14 = uVar14 + 1;
          if (uVar13 == uVar14) {
            return iVar2;
          }
        }
        break;
      default:
        *(undefined4 *)(ud + 0x50) = 3;
        return iVar2;
      }
      return (int)uVar14;
    }
  }
  *(undefined4 *)(ud + 0x50) = 7;
  return iVar2;
}

Assistant:

CAPSTONE_API cs_op_index(csh ud, const cs_insn *insn, unsigned int op_type,
		unsigned int post)
{
	struct cs_struct *handle;
	unsigned int count = 0, i;
	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return -1;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	handle->errnum = CS_ERR_OK;

	switch (handle->arch) {
		default:
			handle->errnum = CS_ERR_HANDLE;
			return -1;
		case CS_ARCH_ARM:
			for (i = 0; i < insn->detail->arm.op_count; i++) {
				if (insn->detail->arm.operands[i].type == (arm_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_ARM64:
			for (i = 0; i < insn->detail->arm64.op_count; i++) {
				if (insn->detail->arm64.operands[i].type == (arm64_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_X86:
			for (i = 0; i < insn->detail->x86.op_count; i++) {
				if (insn->detail->x86.operands[i].type == (x86_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_MIPS:
			for (i = 0; i < insn->detail->mips.op_count; i++) {
				if (insn->detail->mips.operands[i].type == (mips_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_PPC:
			for (i = 0; i < insn->detail->ppc.op_count; i++) {
				if (insn->detail->ppc.operands[i].type == (ppc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SPARC:
			for (i = 0; i < insn->detail->sparc.op_count; i++) {
				if (insn->detail->sparc.operands[i].type == (sparc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SYSZ:
			for (i = 0; i < insn->detail->sysz.op_count; i++) {
				if (insn->detail->sysz.operands[i].type == (sysz_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_XCORE:
			for (i = 0; i < insn->detail->xcore.op_count; i++) {
				if (insn->detail->xcore.operands[i].type == (xcore_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_M68K:
			for (i = 0; i < insn->detail->m68k.op_count; i++) {
				if (insn->detail->m68k.operands[i].type == (m68k_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_TMS320C64X:
			for (i = 0; i < insn->detail->tms320c64x.op_count; i++) {
				if (insn->detail->tms320c64x.operands[i].type == (tms320c64x_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_M680X:
			for (i = 0; i < insn->detail->m680x.op_count; i++) {
				if (insn->detail->m680x.operands[i].type == (m680x_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_EVM:
#if 0
			for (i = 0; i < insn->detail->evm.op_count; i++) {
				if (insn->detail->evm.operands[i].type == (evm_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
#endif
			break;
		case CS_ARCH_MOS65XX:
			for (i = 0; i < insn->detail->mos65xx.op_count; i++) {
				if (insn->detail->mos65xx.operands[i].type == (mos65xx_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
	}

	return -1;
}